

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int test_mp_check_ext_data(void)

{
  mp_check_ext_data_f p_Var1;
  int iVar2;
  char *p;
  
  _plan(0x18,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_check_ext_data");
  p_Var1 = mp_check_ext_data;
  mp_check_ext_data = mp_check_ext_data_test;
  p = anon_var_dwarf_ddb;
  iVar2 = mp_check(&p,anon_var_dwarf_ddb + 3);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x00\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x630,
      "invalid ext8 - bad type");
  p = anon_var_dwarf_dff;
  iVar2 = mp_check(&p,anon_var_dwarf_dff + 4);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x01\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x631,
      "invalid ext8 - bad data");
  p = anon_var_dwarf_e23;
  iVar2 = mp_check(&p,anon_var_dwarf_e23 + 4);
  _ok((uint)(iVar2 == 0),"mp_check(&p, p + sizeof(\"\\xc7\\x01\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x632,
      "valid ext8");
  p = anon_var_dwarf_e47;
  iVar2 = mp_check(&p,anon_var_dwarf_e47 + 4);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x00\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x635,
      "invalid ext16 - bad type");
  p = anon_var_dwarf_e77;
  iVar2 = mp_check(&p,anon_var_dwarf_e77 + 5);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x01\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x636,
      "invalid ext16 - bad data");
  p = anon_var_dwarf_e9b;
  iVar2 = mp_check(&p,anon_var_dwarf_e9b + 5);
  _ok((uint)(iVar2 == 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x01\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x637,
      "valid ext16");
  p = anon_var_dwarf_ecb;
  iVar2 = mp_check(&p,anon_var_dwarf_ecb + 6);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x00\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63a,
      "invalid ext32 - bad type");
  p = anon_var_dwarf_eef;
  iVar2 = mp_check(&p,anon_var_dwarf_eef + 7);
  _ok((uint)(iVar2 != 0),
      "mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x01\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63b,
      "invalid ext32 - bad data");
  p = anon_var_dwarf_f13;
  iVar2 = mp_check(&p,anon_var_dwarf_f13 + 7);
  _ok((uint)(iVar2 == 0),
      "mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x01\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63c,
      "valid ext32");
  p = anon_var_dwarf_f37;
  iVar2 = mp_check(&p,anon_var_dwarf_f37 + 3);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xd4\\x13\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63f,
      "invalid fixext8 - bad type");
  p = anon_var_dwarf_f67;
  iVar2 = mp_check(&p,anon_var_dwarf_f67 + 3);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xd4\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x640,
      "invalid fixext8 - bad data");
  p = anon_var_dwarf_f8b;
  iVar2 = mp_check(&p,anon_var_dwarf_f8b + 3);
  _ok((uint)(iVar2 == 0),"mp_check(&p, p + sizeof(\"\\xd4\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x641,
      "valid fixext8");
  p = anon_var_dwarf_faf;
  iVar2 = mp_check(&p,anon_var_dwarf_faf + 4);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xd5\\x13\\x02\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x644,
      "invalid fixext16 - bad type");
  p = anon_var_dwarf_fd3;
  iVar2 = mp_check(&p,anon_var_dwarf_fd3 + 4);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xd5\\x42\\x13\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x645,
      "invalid fixext16 - bad data");
  p = anon_var_dwarf_ff7;
  iVar2 = mp_check(&p,anon_var_dwarf_ff7 + 4);
  _ok((uint)(iVar2 == 0),"mp_check(&p, p + sizeof(\"\\xd5\\x42\\x02\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x646,
      "valid fixext16");
  p = anon_var_dwarf_101b;
  iVar2 = mp_check(&p,anon_var_dwarf_101b + 6);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xd6\\x13\\x04\\x03\\x02\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x649,
      "invalid fixext32 - bad type");
  p = anon_var_dwarf_103f;
  iVar2 = mp_check(&p,anon_var_dwarf_103f + 6);
  _ok((uint)(iVar2 != 0),"mp_check(&p, p + sizeof(\"\\xd6\\x42\\x13\\x13\\x13\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x64a,
      "invalid fixext32 - bad data");
  p = anon_var_dwarf_1063;
  iVar2 = mp_check(&p,anon_var_dwarf_1063 + 6);
  _ok((uint)(iVar2 == 0),"mp_check(&p, p + sizeof(\"\\xd6\\x42\\x04\\x03\\x02\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x64b,
      "valid fixext32");
  p = anon_var_dwarf_1087;
  iVar2 = mp_check(&p,anon_var_dwarf_1087 + 10);
  _ok((uint)(iVar2 != 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x13\\x08\\x07\\x06\\x05\\x04\\x03\\x02\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x64f,
      "invalid fixext64 - bad type");
  p = anon_var_dwarf_10b7;
  iVar2 = mp_check(&p,anon_var_dwarf_10b7 + 10);
  _ok((uint)(iVar2 != 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x42\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x651,
      "invalid fixext64 - bad data");
  p = anon_var_dwarf_10db;
  iVar2 = mp_check(&p,anon_var_dwarf_10db + 10);
  _ok((uint)(iVar2 == 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x42\\x08\\x07\\x06\\x05\\x04\\x03\\x02\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x653,
      "valid fixext64");
  p = anon_var_dwarf_10ff;
  iVar2 = mp_check(&p,anon_var_dwarf_10ff + 0x12);
  _ok((uint)(iVar2 != 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x13\\x10\\x0f\\x0e\\x0d\\x0c\\x0b\\x0a\\x09\\x08\\x07\\x06\\x05\\x04\" \"\\x03\\x02\\x01\") - 1) != 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x657
      ,"invalid fixext128 - bad type");
  p = anon_var_dwarf_113b;
  iVar2 = mp_check(&p,anon_var_dwarf_113b + 0x12);
  _ok((uint)(iVar2 != 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x42\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\" \"\\x13\\x13\\x13\") - 1) != 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x659
      ,"invalid fixext128 - bad data");
  p = anon_var_dwarf_115f;
  iVar2 = mp_check(&p,anon_var_dwarf_115f + 0x12);
  _ok((uint)(iVar2 == 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x42\\x10\\x0f\\x0e\\x0d\\x0c\\x0b\\x0a\\x09\\x08\\x07\\x06\\x05\\x04\" \"\\x03\\x02\\x01\") - 1) == 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x65b
      ,"valid fixext128");
  mp_check_ext_data = p_Var1;
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_check_ext_data");
  iVar2 = check_plan();
  return iVar2;
}

Assistant:

int
test_mp_check_ext_data()
{
	plan(24);
	header();

#define invalid(data, fmt, ...) ({ \
	const char *p = data; \
	isnt(mp_check(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})
#define valid(data, fmt, ...) ({ \
	const char *p = data; \
	is(mp_check(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})

	mp_check_ext_data_f mp_check_ext_data_svp = mp_check_ext_data;
	mp_check_ext_data = mp_check_ext_data_test;

	/* ext8 */
	invalid("\xc7\x00\x13", "invalid ext8 - bad type");
	invalid("\xc7\x01\x42\x13", "invalid ext8 - bad data");
	valid("\xc7\x01\x42\x01", "valid ext8");

	/* ext16 */
	invalid("\xc8\x00\x00\x13", "invalid ext16 - bad type");
	invalid("\xc8\x00\x01\x42\x13", "invalid ext16 - bad data");
	valid("\xc8\x00\x01\x42\x01", "valid ext16");

	/* ext32 */
	invalid("\xc9\x00\x00\x00\x00\x13", "invalid ext32 - bad type");
	invalid("\xc9\x00\x00\x00\x01\x42\x13", "invalid ext32 - bad data");
	valid("\xc9\x00\x00\x00\x01\x42\x01", "valid ext32");

	/* fixext8 */
	invalid("\xd4\x13\x01", "invalid fixext8 - bad type");
	invalid("\xd4\x42\x13", "invalid fixext8 - bad data");
	valid("\xd4\x42\x01", "valid fixext8");

	/* fixext16 */
	invalid("\xd5\x13\x02\x01", "invalid fixext16 - bad type");
	invalid("\xd5\x42\x13\x13", "invalid fixext16 - bad data");
	valid("\xd5\x42\x02\x01", "valid fixext16");

	/* fixext32 */
	invalid("\xd6\x13\x04\x03\x02\x01", "invalid fixext32 - bad type");
	invalid("\xd6\x42\x13\x13\x13\x13", "invalid fixext32 - bad data");
	valid("\xd6\x42\x04\x03\x02\x01", "valid fixext32");

	/* fixext64 */
	invalid("\xd7\x13\x08\x07\x06\x05\x04\x03\x02\x01",
		"invalid fixext64 - bad type");
	invalid("\xd7\x42\x13\x13\x13\x13\x13\x13\x13\x13",
		"invalid fixext64 - bad data");
	valid("\xd7\x42\x08\x07\x06\x05\x04\x03\x02\x01",
	      "valid fixext64");

	/* fixext128 */
	invalid("\xd8\x13\x10\x0f\x0e\x0d\x0c\x0b\x0a\x09\x08\x07\x06\x05\x04"
		"\x03\x02\x01", "invalid fixext128 - bad type");
	invalid("\xd8\x42\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13"
		"\x13\x13\x13", "invalid fixext128 - bad data");
	valid("\xd8\x42\x10\x0f\x0e\x0d\x0c\x0b\x0a\x09\x08\x07\x06\x05\x04"
	      "\x03\x02\x01", "valid fixext128");

	mp_check_ext_data = mp_check_ext_data_svp;

#undef valid
#undef invalid

	footer();
	return check_plan();
}